

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test::TestBody
          (SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test *this)

{
  WrapperMock *this_00;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *this_01;
  ReturnAction<int> RStack_148;
  TextureId local_134;
  MatcherBase<const_std::optional<SDL_Rect>_&> local_130;
  MatcherBase<const_std::optional<SDL_Rect>_&> local_118;
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> local_100;
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&> local_e8
  ;
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  local_d0;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  local_80;
  
  this_00 = &((this->super_SDLGraphicsSystemWithLoadedTexture).
              super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
             rawPointer)->super_WrapperMock;
  local_a8 = 2;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_e8,(PointerMatcher *)&local_a8);
  local_b0 = 3;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &local_100,(PointerMatcher *)&local_b0);
  local_90 = 0xf0000000a;
  local_88 = 0x1e00000014;
  testing::internal::MatcherBaseImpl::operator_cast_to_Matcher
            ((Matcher<const_std::optional<SDL_Rect>_&> *)&local_118,(MatcherBaseImpl *)&local_90);
  local_a0 = 0x110000000d;
  local_98 = 0x1e00000014;
  testing::internal::MatcherBaseImpl::operator_cast_to_Matcher
            ((Matcher<const_std::optional<SDL_Rect>_&> *)&local_130,(MatcherBaseImpl *)&local_a0);
  SDL::WrapperMock::gmock_renderCopy
            (&local_80,this_00,
             (Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_e8,
             (Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &local_100,(Matcher<const_std::optional<SDL_Rect>_&> *)&local_118,
             (Matcher<const_std::optional<SDL_Rect>_&> *)&local_130);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            ::InternalExpectedAt
                      (&local_80,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x16b,"*sdlMock",
                       "renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr), IsOptionalEq(srcRect), IsOptionalEq(dstRect))"
                      );
  testing::internal::ReturnAction<int>::ReturnAction(&RStack_148,0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_d0,(ReturnAction *)&RStack_148);
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::WillOnce(this_01,&local_d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_148.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  ::~_Tuple_impl(&local_80.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                );
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase(&local_130);
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase(&local_118);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
  ~MatcherBase(&local_100);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase(&local_e8);
  local_134.t = (anonymous_namespace)::textureId0;
  SDLGraphicsSystem::renderTexture
            (&(this->super_SDLGraphicsSystemWithLoadedTexture).
              super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system,
             &local_134,(Position *)&(anonymous_namespace)::texturePosition,
             (Area *)(anonymous_namespace)::textureArea);
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture, renderTextureSuccessfully) {
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   IsOptionalEq(srcRect), IsOptionalEq(dstRect))
    ).WillOnce(Return(success));

    system.renderTexture(textureId0, texturePosition, textureArea);
    expectQuitSystemWithLoadedTexture();
}